

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::read_tga_file(TGAImage *this,char *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  uchar *puVar4;
  unsigned_long nbytes;
  char local_248;
  TGA_Header header;
  ifstream local_228 [8];
  ifstream in;
  char *filename_local;
  TGAImage *this_local;
  
  if ((this->data != (uchar *)0x0) && (this->data != (uchar *)0x0)) {
    operator_delete__(this->data);
  }
  this->data = (uchar *)0x0;
  std::ifstream::ifstream(local_228);
  std::ifstream::open((char *)local_228,(_Ios_Openmode)filename);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar3 = std::operator<<(poVar3,filename);
    std::operator<<(poVar3,"\n");
    std::ifstream::close();
    this_local._7_1_ = false;
  }
  else {
    std::istream::read((char *)local_228,(long)&nbytes + 6);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::ifstream::close();
      std::operator<<((ostream *)&std::cerr,"an error occured while reading the header\n");
      this_local._7_1_ = false;
    }
    else {
      this->width = (int)(short)header._4_2_;
      this->height = (int)(short)header._6_2_;
      this->bytespp = (int)(char)header.x_origin >> 3;
      if (((this->width < 1) || (this->height < 1)) ||
         ((this->bytespp != 1 && ((this->bytespp != 3 && (this->bytespp != 4)))))) {
        std::ifstream::close();
        std::operator<<((ostream *)&std::cerr,"bad bpp (or width/height) value\n");
        this_local._7_1_ = false;
      }
      else {
        puVar4 = (uchar *)operator_new__((long)(this->bytespp * this->width * this->height));
        this->data = puVar4;
        if ((local_248 == '\x03') || (local_248 == '\x02')) {
          std::istream::read((char *)local_228,(long)this->data);
          bVar1 = std::ios::good();
          if ((bVar1 & 1) == 0) {
            std::ifstream::close();
            std::operator<<((ostream *)&std::cerr,"an error occured while reading the data\n");
            this_local._7_1_ = false;
            goto LAB_0010dedc;
          }
        }
        else {
          if ((local_248 != '\n') && (local_248 != '\v')) {
            std::ifstream::close();
            poVar3 = std::operator<<((ostream *)&std::cerr,"unknown file format ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)local_248);
            std::operator<<(poVar3,"\n");
            this_local._7_1_ = false;
            goto LAB_0010dedc;
          }
          bVar2 = load_rle_data(this,local_228);
          if (!bVar2) {
            std::ifstream::close();
            std::operator<<((ostream *)&std::cerr,"an error occured while reading the data\n");
            this_local._7_1_ = false;
            goto LAB_0010dedc;
          }
        }
        if ((header.x_origin._1_1_ & 0x20) == 0) {
          flip_vertically(this);
        }
        if ((header.x_origin._1_1_ & 0x10) != 0) {
          flip_horizontally(this);
        }
        poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,this->width);
        poVar3 = std::operator<<(poVar3,"x");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->height);
        poVar3 = std::operator<<(poVar3,"/");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->bytespp << 3);
        std::operator<<(poVar3,"\n");
        std::ifstream::close();
        this_local._7_1_ = true;
      }
    }
  }
LAB_0010dedc:
  header.y_origin = 1;
  header.width = 0;
  std::ifstream::~ifstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool TGAImage::read_tga_file(const char *filename) {
    if (data) delete [] data;
    data = NULL;
    std::ifstream in;
    in.open (filename, std::ios::binary);
    if (!in.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        in.close();
        return false;
    }
    TGA_Header header;
    in.read((char *)&header, sizeof(header));
    if (!in.good()) {
        in.close();
        std::cerr << "an error occured while reading the header\n";
        return false;
    }
    width   = header.width;
    height  = header.height;
    bytespp = header.bitsperpixel>>3;
    if (width<=0 || height<=0 || (bytespp!=GRAYSCALE && bytespp!=RGB && bytespp!=RGBA)) {
        in.close();
        std::cerr << "bad bpp (or width/height) value\n";
        return false;
    }
    unsigned long nbytes = bytespp*width*height;
    data = new unsigned char[nbytes];
    if (3==header.datatypecode || 2==header.datatypecode) {
        in.read((char *)data, nbytes);
        if (!in.good()) {
            in.close();
            std::cerr << "an error occured while reading the data\n";
            return false;
        }
    } else if (10==header.datatypecode||11==header.datatypecode) {
        if (!load_rle_data(in)) {
            in.close();
            std::cerr << "an error occured while reading the data\n";
            return false;
        }
    } else {
        in.close();
        std::cerr << "unknown file format " << (int)header.datatypecode << "\n";
        return false;
    }
    if (!(header.imagedescriptor & 0x20)) {
        flip_vertically();
    }
    if (header.imagedescriptor & 0x10) {
        flip_horizontally();
    }
    std::cerr << width << "x" << height << "/" << bytespp*8 << "\n";
    in.close();
    return true;
}